

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

void __thiscall cmCTestCurl::cmCTestCurl(cmCTestCurl *this,cmCTest *ctest)

{
  CURL_conflict *pCVar1;
  cmCTest *ctest_local;
  cmCTestCurl *this_local;
  
  this->CTest = ctest;
  cmCTestCurlOpts::cmCTestCurlOpts(&this->CurlOpts,ctest);
  this->Curl = (CURL *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HttpHeaders);
  std::__cxx11::string::string((string *)&this->HTTPProxyAuth);
  std::__cxx11::string::string((string *)&this->HTTPProxy);
  this->UseHttp10 = false;
  this->Quiet = false;
  this->TimeOutSeconds = 0;
  SetProxyType(this);
  curl_global_init(3);
  pCVar1 = curl_easy_init();
  this->Curl = pCVar1;
  return;
}

Assistant:

cmCTestCurl::cmCTestCurl(cmCTest* ctest)
  : CTest(ctest)
  , CurlOpts(ctest)
{
  this->SetProxyType();
  // In windows, this will init the winsock stuff
  ::curl_global_init(CURL_GLOBAL_ALL);
  this->Curl = curl_easy_init();
}